

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O1

char * HPDF_StrStr(char *s1,char *s2,HPDF_UINT maxlen)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  char cVar7;
  
  uVar4 = (ulong)maxlen;
  lVar6 = 0;
  if ((s2 != (char *)0x0) && (*s2 != '\0')) {
    lVar6 = 0;
    do {
      lVar1 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (s2[lVar1] != '\0');
  }
  uVar2 = (uint)lVar6;
  if (s1 != (char *)0x0) {
    if (uVar2 == 0) {
      return s1;
    }
    if (maxlen == 0) {
      if (*s1 == '\0') {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          lVar6 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while (s1[lVar6] != '\0');
      }
    }
    if ((uVar2 <= (uint)uVar4) && (iVar3 = ((uint)uVar4 - uVar2) + 1, iVar3 != 0)) {
      do {
        cVar5 = *s1;
        cVar7 = *s2;
        if (cVar5 == *s2) {
          lVar6 = 1;
          do {
            if (uVar2 == (uint)lVar6) {
              return s1;
            }
            cVar5 = s1[lVar6];
            cVar7 = s2[lVar6];
            lVar6 = lVar6 + 1;
          } while (cVar5 == cVar7);
        }
        if (cVar5 == cVar7) {
          return s1;
        }
        s1 = s1 + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  return (char *)0x0;
}

Assistant:

const char*
HPDF_StrStr  (const char   *s1,
              const char   *s2,
              HPDF_UINT     maxlen)
{
    HPDF_UINT len = HPDF_StrLen (s2, -1);

    if (!s1)
        return NULL;

    if (len == 0)
        return s1;

    if (maxlen == 0)
        maxlen = HPDF_StrLen (s1, -1);

    if (maxlen < len)
        return NULL;

    maxlen -= len;
    maxlen++;

    while (maxlen > 0) {
        if (HPDF_MemCmp ((HPDF_BYTE *)s1, (HPDF_BYTE *)s2, len) == 0)
            return s1;

        s1++;
        maxlen--;
    }

    return NULL;
}